

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak)

{
  uint uVar1;
  bool bVar2;
  int local_70;
  uint local_6c;
  int overflow;
  int ret;
  secp256k1_scalar sec;
  secp256k1_scalar factor;
  uchar *tweak_local;
  uchar *seckey_local;
  secp256k1_context *ctx_local;
  
  local_6c = 0;
  local_70 = 0;
  if (seckey == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"seckey != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (tweak == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"tweak != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_set_b32((secp256k1_scalar *)(sec.d + 3),tweak,&local_70);
    local_6c = secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)&overflow,seckey);
    bVar2 = local_70 != 0;
    uVar1 = secp256k1_eckey_privkey_tweak_mul
                      ((secp256k1_scalar *)&overflow,(secp256k1_scalar *)(sec.d + 3));
    local_6c = ((bVar2 ^ 0xffU) & 1) & uVar1 & local_6c;
    secp256k1_scalar_cmov
              ((secp256k1_scalar *)&overflow,&secp256k1_scalar_zero,
               (uint)((local_6c != 0 ^ 0xffU) & 1));
    secp256k1_scalar_get_b32(seckey,(secp256k1_scalar *)&overflow);
    secp256k1_scalar_clear((secp256k1_scalar *)&overflow);
    secp256k1_scalar_clear((secp256k1_scalar *)(sec.d + 3));
    ctx_local._4_4_ = local_6c;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&factor, tweak, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}